

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::BlindTxOutRequestStruct,_std::allocator<cfd::js::api::BlindTxOutRequestStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>::
ConvertToStruct(vector<cfd::js::api::BlindTxOutRequestStruct,_std::allocator<cfd::js::api::BlindTxOutRequestStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>
               *this)

{
  bool bVar1;
  undefined1 local_b8 [8];
  BlindTxOutRequestStruct data;
  BlindTxOutRequest *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>
  *this_local;
  vector<cfd::js::api::BlindTxOutRequestStruct,_std::allocator<cfd::js::api::BlindTxOutRequestStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::BlindTxOutRequestStruct,_std::allocator<cfd::js::api::BlindTxOutRequestStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::BlindTxOutRequest>).
                    super_vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
                  );
  element = (BlindTxOutRequest *)
            std::
            vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::BlindTxOutRequest>).
                   super_vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::BlindTxOutRequest_*,_std::vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::BlindTxOutRequest_*,_std::vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>_>
                 ::operator*(&__end0);
    js::api::json::BlindTxOutRequest::ConvertToStruct
              ((BlindTxOutRequestStruct *)local_b8,
               (BlindTxOutRequest *)
               data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cfd::js::api::BlindTxOutRequestStruct,_std::allocator<cfd::js::api::BlindTxOutRequestStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_b8);
    js::api::BlindTxOutRequestStruct::~BlindTxOutRequestStruct((BlindTxOutRequestStruct *)local_b8);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::BlindTxOutRequest_*,_std::vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }